

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O2

bool __thiscall cmGeneratorTarget::HasImportLibrary(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  TargetType TVar4;
  ManagedType MVar5;
  cmValue l;
  string_view r;
  allocator<char> local_41;
  string local_40;
  
  iVar3 = (*this->LocalGenerator->GlobalGenerator->_vptr_cmGlobalGenerator[0x29])();
  bVar1 = true;
  if ((char)iVar3 != '\0') {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS",&local_41);
    l = GetProperty(this,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    if (l.Value == (string *)0x0) {
      this_00 = this->Makefile;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_40,"CMAKE_XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS",&local_41);
      l = cmMakefile::GetDefinition(this_00,&local_40);
      std::__cxx11::string::~string((string *)&local_40);
      if (l.Value == (string *)0x0) goto LAB_0044a7cb;
    }
    r._M_str = "YES";
    r._M_len = 3;
    bVar1 = ::operator==(l,r);
  }
LAB_0044a7cb:
  bVar2 = IsDLLPlatform(this);
  if ((bVar2) &&
     (((TVar4 = GetType(this), TVar4 == SHARED_LIBRARY ||
       (bVar2 = IsExecutableWithExports(this), bVar2)) &&
      (MVar5 = GetManagedType(this,config), MVar5 != Managed)))) {
    return true;
  }
  bVar2 = IsAIX(this);
  if ((bVar2) && (bVar2 = IsExecutableWithExports(this), bVar2)) {
    return true;
  }
  bVar2 = cmMakefile::PlatformSupportsAppleTextStubs(this->Makefile);
  if (bVar2) {
    bVar2 = IsSharedLibraryWithExports(this);
    bVar1 = (bool)(bVar1 & bVar2);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmGeneratorTarget::HasImportLibrary(std::string const& config) const
{
  bool generate_Stubs = true;
  if (this->GetGlobalGenerator()->IsXcode()) {
    // take care of CMAKE_XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS variable
    // as well as XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS property
    if (cmValue propGenStubs =
          this->GetProperty("XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS")) {
      generate_Stubs = propGenStubs == "YES";
    } else if (cmValue varGenStubs = this->Makefile->GetDefinition(
                 "CMAKE_XCODE_ATTRIBUTE_GENERATE_TEXT_BASED_STUBS")) {
      generate_Stubs = varGenStubs == "YES";
    }
  }

  return (this->IsDLLPlatform() &&
          (this->GetType() == cmStateEnums::SHARED_LIBRARY ||
           this->IsExecutableWithExports()) &&
          // Assemblies which have only managed code do not have
          // import libraries.
          this->GetManagedType(config) != ManagedType::Managed) ||
    (this->IsAIX() && this->IsExecutableWithExports()) ||
    (this->Makefile->PlatformSupportsAppleTextStubs() &&
     this->IsSharedLibraryWithExports() && generate_Stubs);
}